

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::NotEqualTest<int,unsigned_short>(void)

{
  undefined4 in_EAX;
  undefined4 uStack_8;
  int local_4;
  
  _uStack_8 = CONCAT44(7,in_EAX);
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             ((long)&uStack_8 + 2),&local_4);
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}